

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::TessCoordTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TessCoordTestInstance *this)

{
  pointer *ppvVar1;
  SpacingMode spacingMode;
  uint uVar2;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkCommandBuffer commandBuffer;
  VkRenderPass renderPass_00;
  VkCommandBuffer_s *pVVar3;
  undefined8 uVar4;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)17>_> data_02;
  RefData<vk::Handle<(vk::HandleType)23>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  RefData<vk::Handle<(vk::HandleType)18>_> data_07;
  bool bVar5;
  deUint32 queueFamilyIndex_00;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  size_type sVar6;
  ulong uVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference this_00;
  iterator iVar10;
  iterator iVar11;
  pointer this_01;
  DescriptorSetLayoutBuilder *pDVar12;
  DescriptorPoolBuilder *pDVar13;
  Handle<(vk::HandleType)21> *pHVar14;
  Handle<(vk::HandleType)19> *pHVar15;
  VkBuffer *pVVar16;
  Handle<(vk::HandleType)22> *pHVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  Handle<(vk::HandleType)17> *pHVar19;
  Handle<(vk::HandleType)24> *pHVar20;
  ProgramCollection<vk::ProgramBinary> *pPVar21;
  ProgramBinary *pPVar22;
  GraphicsPipelineBuilder *pGVar23;
  Handle<(vk::HandleType)16> *pHVar24;
  TestContext *pTVar25;
  TestLog *this_02;
  MessageBuilder *pMVar26;
  Allocation *pAVar27;
  undefined8 *puVar28;
  VkDeviceMemory VVar29;
  VkDeviceSize VVar30;
  void *pvVar31;
  VkCommandBuffer_s **ppVVar32;
  Handle<(vk::HandleType)23> *pHVar33;
  Handle<(vk::HandleType)18> *pHVar34;
  uint *puVar35;
  TessPrimitiveType TVar36;
  int stride;
  allocator<char> local_1219;
  string local_1218;
  byte local_11f3;
  byte local_11f2;
  allocator<char> local_11f1;
  string local_11f0;
  MessageBuilder local_11d0;
  MessageBuilder local_1050;
  MessageBuilder local_ed0;
  MessageBuilder local_d50;
  MessageBuilder local_bd0;
  TestLog *local_a50;
  TestLog *log;
  reference pvStack_a40;
  int numExpectedResults;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *referenceTessCoords;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> resultTessCoords;
  deInt32 numResults;
  Allocation *resultAlloc;
  undefined1 local_a00 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  Allocation *alloc_1;
  TessLevels *bufferTessLevels;
  Allocation *alloc;
  MessageBuilder local_960;
  uint local_7e0;
  uint local_7dc;
  deUint32 tessLevelCaseNdx;
  deUint32 numPassedCases;
  VkPipelineLayout local_7d0;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  GraphicsPipelineBuilder local_750;
  Move<vk::Handle<(vk::HandleType)18>_> local_648;
  RefData<vk::Handle<(vk::HandleType)18>_> local_628;
  undefined1 local_608 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::VkCommandBuffer_s_*> local_5e0;
  RefData<vk::VkCommandBuffer_s_*> local_5c0;
  undefined1 local_5a0 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_560;
  undefined1 local_540 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_518;
  RefData<vk::Handle<(vk::HandleType)16>_> local_4f8;
  undefined1 local_4d8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_4b0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_490;
  undefined1 local_470 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_430;
  undefined1 local_410 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Location local_3e0;
  VkDescriptorSet local_3d8;
  DescriptorSetUpdateBuilder local_3d0;
  deUint64 local_388;
  undefined1 local_380 [8];
  VkDescriptorBufferInfo resultBufferInfo;
  undefined1 local_360 [8];
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_338;
  RefData<vk::Handle<(vk::HandleType)22>_> local_318;
  undefined1 local_2f8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_2c0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_2a0;
  undefined1 local_280 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_218;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_1b0;
  undefined1 local_178 [8];
  Buffer resultBuffer;
  VkDeviceSize resultBufferSizeBytes;
  int extraneousVertices;
  int resultBufferTessCoordsOffset;
  undefined1 local_f8 [8];
  Buffer tessLevelsBuffer;
  __normal_iterator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_*,_std::vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>_>
  local_b0;
  long local_a8;
  size_t maxNumVertices;
  uint local_88;
  deUint32 i;
  allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_> local_71;
  undefined1 local_70 [8];
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  allReferenceTessCoords;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  TessCoordTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ppvVar1 = &allReferenceTessCoords.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  genTessLevelCases((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     *)ppvVar1,this->m_primitiveType,this->m_spacingMode);
  sVar6 = std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  *)ppvVar1);
  std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>::
  allocator(&local_71);
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            *)local_70,sVar6,&local_71);
  std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>::
  ~allocator(&local_71);
  for (local_88 = 0; uVar7 = (ulong)local_88,
      sVar6 = std::
              vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      *)&allReferenceTessCoords.
                         super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar7 < sVar6;
      local_88 = local_88 + 1) {
    TVar36 = this->m_primitiveType;
    spacingMode = this->m_spacingMode;
    ppvVar1 = &allReferenceTessCoords.
               super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar8 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)ppvVar1,(ulong)local_88);
    pvVar9 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)ppvVar1,(ulong)local_88);
    generateReferenceTessCoords
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &maxNumVertices,TVar36,spacingMode,pvVar8->inner,pvVar9->outer);
    this_00 = std::
              vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
              ::operator[]((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                            *)local_70,(ulong)local_88);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator=
              (this_00,(vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       &maxNumVertices);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &maxNumVertices);
  }
  iVar10 = std::
           vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ::begin((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                    *)local_70);
  iVar11 = std::
           vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ::end((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                  *)local_70);
  local_b0 = std::
             max_element<__gnu_cxx::__normal_iterator<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>*,std::vector<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>,std::allocator<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>>>,vkt::tessellation::(anonymous_namespace)::SizeLessThan<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>>
                       (iVar10._M_current,iVar11._M_current);
  this_01 = __gnu_cxx::
            __normal_iterator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_*,_std::vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>_>
            ::operator->(&local_b0);
  sVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size(this_01)
  ;
  local_a8 = (long)(int)sVar6;
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultBufferTessCoordsOffset,0x18,0x20);
  tessellation::Buffer::Buffer
            ((Buffer *)local_f8,vk_00,device_00,allocator_00,
             (VkBufferCreateInfo *)&resultBufferTessCoordsOffset,
             ::vk::MemoryRequirement::HostVisible);
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = local_a8 * 0x10 + 0x110;
  makeBufferCreateInfo
            (&local_1b0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x20
            );
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_178,vk_00,device_00,allocator_00,&local_1b0,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build(&local_218,pDVar12,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)&local_218);
  data.deleter.m_deviceIface._0_4_ = (int)local_1f8.deleter.m_deviceIface;
  data.object.m_internal = local_1f8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1f8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_1f8.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_1f8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_1f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1d8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_218);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType(pDVar13,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_2c0,pDVar13,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a0,(Move *)&local_2c0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2a0.deleter.m_deviceIface;
  data_00.object.m_internal = local_2a0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2a0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_2a0.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_2a0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_280,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_2c0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_280);
  descriptorPool_00.m_internal = pHVar14->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1d8);
  tessLevelsBufferInfo.range = pHVar15->m_internal;
  makeDescriptorSet(&local_338,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)tessLevelsBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_318,(Move *)&local_338);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_318.deleter.m_deviceIface;
  data_01.object.m_internal = local_318.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_318.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_318.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_318.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_318.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2f8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_338);
  pVVar16 = tessellation::Buffer::get((Buffer *)local_f8);
  resultBufferInfo.range = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_360,(VkBuffer)resultBufferInfo.range,0,0x18);
  pVVar16 = tessellation::Buffer::get((Buffer *)local_178);
  local_388 = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_380,(VkBuffer)local_388,0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_3d0);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
  local_3d8.m_internal = pHVar17->m_internal;
  local_3e0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_3d0,local_3d8,&local_3e0,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_360);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
  destSet.m_internal = pHVar17->m_internal;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar18,destSet,
                       (Location *)
                       &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_380);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_3d0);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_430,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_430.deleter.m_deviceIface;
  data_02.object.m_internal = local_430.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_430.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_430.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_430.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_430.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_410,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_410);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar19->m_internal;
  makeFramebufferWithoutAttachments
            (&local_4b0,vk_00,device_00,
             (VkRenderPass)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
             m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_490,(Move *)&local_4b0);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_490.deleter.m_deviceIface;
  data_03.object.m_internal = local_490.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_490.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_490.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_490.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_490.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_470,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_4b0);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1d8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  makePipelineLayout(&local_518,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4f8,(Move *)&local_518);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_4f8.deleter.m_deviceIface;
  data_04.object.m_internal = local_4f8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4f8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_4f8.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_4f8.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_4f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_4d8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_518);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_560,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_560.deleter.m_deviceIface;
  data_05.object.m_internal = local_560.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_560.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_560.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_560.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_560.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_540,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_540);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar20->m_internal;
  ::vk::allocateCommandBuffer
            (&local_5e0,vk_00,device_00,
             (VkCommandPool)
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5c0,(Move *)&local_5e0);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_5c0.deleter.m_deviceIface;
  data_06.object = local_5c0.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5c0.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_5c0.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_5c0.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_5c0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5a0,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_5e0);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_750);
  pPVar21 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"vert",&local_771);
  pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar21,&local_770);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (&local_750,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar22,
                       (VkSpecializationInfo *)0x0);
  pPVar21 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"tesc",&local_799);
  pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar21,&local_798);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (pGVar23,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar22,
                       (VkSpecializationInfo *)0x0);
  pPVar21 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"tese",&local_7c1);
  pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar21,&local_7c0);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (pGVar23,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar22,
                       (VkSpecializationInfo *)0x0);
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_4d8);
  local_7d0.m_internal = pHVar24->m_internal;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_410);
  _tessLevelCaseNdx = pHVar19->m_internal;
  GraphicsPipelineBuilder::build(&local_648,pGVar23,vk_00,device_00,local_7d0,_tessLevelCaseNdx);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_628,(Move *)&local_648);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_628.deleter.m_deviceIface;
  data_07.object.m_internal = local_628.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_628.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_628.deleter.m_device;
  data_07.deleter.m_allocator._0_4_ = (int)local_628.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_628.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_608,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_648);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_750);
  local_7dc = 0;
  for (local_7e0 = 0; uVar7 = (ulong)local_7e0,
      sVar6 = std::
              vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      *)&allReferenceTessCoords.
                         super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar7 < sVar6;
      local_7e0 = local_7e0 + 1) {
    pTVar25 = Context::getTestContext((this->super_TestInstance).m_context);
    TVar36 = (TessPrimitiveType)sVar6;
    this_02 = tcu::TestContext::getLog(pTVar25);
    tcu::TestLog::operator<<(&local_960,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar26 = tcu::MessageBuilder::operator<<(&local_960,(char (*) [22])"Tessellation levels: ");
    pvVar8 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)&allReferenceTessCoords.
                            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_7e0);
    getTessellationLevelsString_abi_cxx11_
              ((string *)&alloc,(tessellation *)pvVar8,(TessLevels *)(ulong)this->m_primitiveType,
               TVar36);
    pMVar26 = tcu::MessageBuilder::operator<<
                        (pMVar26,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&alloc);
    tcu::MessageBuilder::operator<<(pMVar26,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&alloc);
    tcu::MessageBuilder::~MessageBuilder(&local_960);
    pAVar27 = tessellation::Buffer::getAllocation((Buffer *)local_f8);
    puVar28 = (undefined8 *)::vk::Allocation::getHostPtr(pAVar27);
    pvVar8 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)&allReferenceTessCoords.
                            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_7e0);
    puVar28[2] = *(undefined8 *)(pvVar8->outer + 2);
    uVar4 = *(undefined8 *)pvVar8->outer;
    *puVar28 = *(undefined8 *)pvVar8->inner;
    puVar28[1] = uVar4;
    VVar29 = ::vk::Allocation::getMemory(pAVar27);
    VVar30 = ::vk::Allocation::getOffset(pAVar27);
    ::vk::flushMappedMemoryRange(vk_00,device_00,VVar29,VVar30,0x18);
    pAVar27 = tessellation::Buffer::getAllocation((Buffer *)local_178);
    pvVar31 = ::vk::Allocation::getHostPtr(pAVar27);
    ::deMemset(pvVar31,0,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    VVar29 = ::vk::Allocation::getMemory(pAVar27);
    VVar30 = ::vk::Allocation::getOffset(pAVar27);
    ::vk::flushMappedMemoryRange
              (vk_00,device_00,VVar29,VVar30,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    beginCommandBuffer(vk_00,*ppVVar32);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    commandBuffer = *ppVVar32;
    pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_410);
    renderPass_00.m_internal = pHVar19->m_internal;
    pHVar33 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_470);
    beginRenderPassWithRasterizationDisabled
              (vk_00,commandBuffer,renderPass_00,(VkFramebuffer)pHVar33->m_internal);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    pVVar3 = *ppVVar32;
    pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_608);
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar3,0,pHVar34->m_internal);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    pVVar3 = *ppVVar32;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_4d8);
    shaderWriteBarrier.size = pHVar24->m_internal;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
    (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar3,0,shaderWriteBarrier.size,0,1,pHVar17,0,0);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar32,1,1,0);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    endRenderPass(vk_00,*ppVVar32);
    pVVar16 = tessellation::Buffer::operator*((Buffer *)local_178);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_a00,0x40,0x2000,(VkBuffer)pVVar16->m_internal,0,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    stride = 0;
    (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar32,0x8000,0x4000,0,0,0,1,local_a00,0,0);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    endCommandBuffer(vk_00,*ppVVar32);
    ppVVar32 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a0);
    submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar32);
    pAVar27 = tessellation::Buffer::getAllocation((Buffer *)local_178);
    VVar29 = ::vk::Allocation::getMemory(pAVar27);
    VVar30 = ::vk::Allocation::getOffset(pAVar27);
    ::vk::invalidateMappedMemoryRange
              (vk_00,device_00,VVar29,VVar30,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    puVar35 = (uint *)::vk::Allocation::getHostPtr(pAVar27);
    uVar2 = *puVar35;
    resultTessCoords.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = uVar2;
    pvVar31 = ::vk::Allocation::getHostPtr(pAVar27);
    readInterleavedData<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &referenceTessCoords,(tessellation *)(ulong)uVar2,(int)pvVar31,(void *)0x10,0x10,
               stride);
    pvStack_a40 = std::
                  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                  ::operator[]((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                                *)local_70,(ulong)local_7e0);
    sVar6 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      (pvStack_a40);
    log._4_4_ = (uint)sVar6;
    pTVar25 = Context::getTestContext((this->super_TestInstance).m_context);
    local_a50 = tcu::TestContext::getLog(pTVar25);
    if ((int)resultTessCoords.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < (int)log._4_4_) {
      tcu::TestLog::operator<<(&local_bd0,local_a50,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar26 = tcu::MessageBuilder::operator<<(&local_bd0,(char (*) [20])"Failure: generated ");
      pMVar26 = tcu::MessageBuilder::operator<<
                          (pMVar26,(int *)((long)&resultTessCoords.
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4));
      pMVar26 = tcu::MessageBuilder::operator<<
                          (pMVar26,(char (*) [51])
                                   " coordinates, but the expected reference value is ");
      pMVar26 = tcu::MessageBuilder::operator<<(pMVar26,(int *)((long)&log + 4));
      tcu::MessageBuilder::operator<<(pMVar26,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_bd0);
    }
    else if (resultTessCoords.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == log._4_4_) {
      tcu::TestLog::operator<<(&local_d50,local_a50,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar26 = tcu::MessageBuilder::operator<<(&local_d50,(char (*) [17])"Note: generated ");
      pMVar26 = tcu::MessageBuilder::operator<<
                          (pMVar26,(int *)((long)&resultTessCoords.
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4));
      pMVar26 = tcu::MessageBuilder::operator<<(pMVar26,(char (*) [26])0x137889e);
      tcu::MessageBuilder::operator<<(pMVar26,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_d50);
    }
    else {
      tcu::TestLog::operator<<(&local_ed0,local_a50,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar26 = tcu::MessageBuilder::operator<<(&local_ed0,(char (*) [17])"Note: generated ");
      pMVar26 = tcu::MessageBuilder::operator<<
                          (pMVar26,(int *)((long)&resultTessCoords.
                                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4));
      pMVar26 = tcu::MessageBuilder::operator<<
                          (pMVar26,(char (*) [28])" coordinates (out of which ");
      pMVar26 = tcu::MessageBuilder::operator<<(pMVar26,(int *)((long)&log + 4));
      pMVar26 = tcu::MessageBuilder::operator<<(pMVar26,(char (*) [17])" must be unique)");
      tcu::MessageBuilder::operator<<(pMVar26,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ed0);
    }
    if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      tcu::TestLog::operator<<(&local_1050,local_a50,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar26 = tcu::MessageBuilder::operator<<
                          (&local_1050,
                           (char (*) [121])
                           "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                          );
      tcu::MessageBuilder::operator<<(pMVar26,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1050);
    }
    else if ((this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) ||
            (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)) {
      tcu::TestLog::operator<<(&local_11d0,local_a50,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar26 = tcu::MessageBuilder::operator<<
                          (&local_11d0,
                           (char (*) [109])
                           "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                          );
      tcu::MessageBuilder::operator<<(pMVar26,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_11d0);
    }
    bVar5 = compareTessCoords(local_a50,this->m_primitiveType,pvStack_a40,
                              (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)&referenceTessCoords);
    if ((bVar5) &&
       ((int)log._4_4_ <=
        (int)resultTessCoords.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
      local_7dc = local_7dc + 1;
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &referenceTessCoords);
  }
  uVar7 = (ulong)local_7dc;
  sVar6 = std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  *)&allReferenceTessCoords.
                     super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_11f2 = 0;
  local_11f3 = 0;
  if (uVar7 == sVar6) {
    std::allocator<char>::allocator();
    local_11f2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11f0,"OK",&local_11f1);
    local_11f3 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_11f0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1218,"Some cases have failed",&local_1219);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1218);
    std::__cxx11::string::~string((string *)&local_1218);
    std::allocator<char>::~allocator(&local_1219);
  }
  if ((local_11f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_11f0);
  }
  if ((local_11f2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_11f1);
  }
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_608);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5a0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_540);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_4d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_470);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_410);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_280);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1d8);
  tessellation::Buffer::~Buffer((Buffer *)local_178);
  tessellation::Buffer::~Buffer((Buffer *)local_f8);
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::~vector((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             *)local_70);
  std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
  ~vector((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_> *)
          &allReferenceTessCoords.
           super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TessCoordTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Test data

	const std::vector<TessLevels>		 tessLevelCases			= genTessLevelCases(m_primitiveType, m_spacingMode);
	std::vector<std::vector<tcu::Vec3> > allReferenceTessCoords	(tessLevelCases.size());

	for (deUint32 i = 0; i < tessLevelCases.size(); ++i)
		allReferenceTessCoords[i] = generateReferenceTessCoords(m_primitiveType, m_spacingMode, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const size_t maxNumVertices = static_cast<int>(std::max_element(allReferenceTessCoords.begin(), allReferenceTessCoords.end(), SizeLessThan<std::vector<tcu::Vec3> >())->size());

	// Input buffer: tessellation levels. Data is filled in later.

	const Buffer tessLevelsBuffer(vk, device, allocator,
		makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of invocations + padding + tessellation coordinates. Initialized later.

	const int          resultBufferTessCoordsOffset	 = 4 * (int)sizeof(deInt32);
	const int          extraneousVertices			 = 16;	// allow some room for extraneous vertices from duplicate shader invocations (number is arbitrary)
	const VkDeviceSize resultBufferSizeBytes		 = resultBufferTessCoordsOffset + (maxNumVertices + extraneousVertices)*sizeof(tcu::Vec4);
	const Buffer       resultBuffer					 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo tessLevelsBufferInfo = makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, sizeof(TessLevels));
	const VkDescriptorBufferInfo resultBufferInfo     = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline: set up vertex processing without rasterization

	const Unique<VkRenderPass>		renderPass		(makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>		framebuffer		(makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.build    (vk, device, *pipelineLayout, *renderPass));

	deUint32 numPassedCases = 0;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], m_primitiveType)
			<< tcu::TestLog::EndMessage;

		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc = tessLevelsBuffer.getAllocation();
			TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
			*bufferTessLevels = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		// Reset the command buffer and begin recording.
		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		// Process a single abstract vertex.
		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify results
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32					numResults			= *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3>	resultTessCoords    = readInterleavedData<tcu::Vec3>(numResults, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));
			const std::vector<tcu::Vec3>&	referenceTessCoords = allReferenceTessCoords[tessLevelCaseNdx];
			const int						numExpectedResults  = static_cast<int>(referenceTessCoords.size());
			tcu::TestLog&					log					= m_context.getTestContext().getLog();

			if (numResults < numExpectedResults)
			{
				log << tcu::TestLog::Message
					<< "Failure: generated " << numResults << " coordinates, but the expected reference value is " << numExpectedResults
					<< tcu::TestLog::EndMessage;
			}
			else if (numResults == numExpectedResults)
				log << tcu::TestLog::Message << "Note: generated " << numResults << " tessellation coordinates" << tcu::TestLog::EndMessage;
			else
			{
				log << tcu::TestLog::Message
					<< "Note: generated " << numResults << " coordinates (out of which " << numExpectedResults << " must be unique)"
					<< tcu::TestLog::EndMessage;
			}

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << tcu::TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << tcu::TestLog::EndMessage;
			else
				DE_ASSERT(false);

			if (compareTessCoords(log, m_primitiveType, referenceTessCoords, resultTessCoords) && (numResults >= numExpectedResults))
				++numPassedCases;
		}
	}  // for tessLevelCaseNdx

	return (numPassedCases == tessLevelCases.size() ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Some cases have failed"));
}